

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
int_writer<char,duckdb_fmt::v6::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  char *pcVar1;
  char *in_RSI;
  int in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  
  pcVar1 = format_decimal<char,char*,unsigned_int>
                     (in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  *(char **)in_RSI = pcVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }